

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_fileresult(lua_State *L,int stat,char *fname)

{
  int __errnum;
  int *piVar1;
  char *local_40;
  char *msg;
  int en;
  char *fname_local;
  int stat_local;
  lua_State *L_local;
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  if (stat == 0) {
    lua_pushnil(L);
    if (__errnum == 0) {
      local_40 = "(no extra info)";
    }
    else {
      local_40 = strerror(__errnum);
    }
    if (fname == (char *)0x0) {
      lua_pushstring(L,local_40);
    }
    else {
      lua_pushfstring(L,"%s: %s",fname,local_40);
    }
    lua_pushinteger(L,(long)__errnum);
    L_local._4_4_ = 3;
  }
  else {
    lua_pushboolean(L,1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_fileresult (lua_State *L, int stat, const char *fname) {
  int en = errno;  /* calls to Lua API may change this value */
  if (stat) {
    lua_pushboolean(L, 1);
    return 1;
  }
  else {
    const char *msg;
    luaL_pushfail(L);
    msg = (en != 0) ? strerror(en) : "(no extra info)";
    if (fname)
      lua_pushfstring(L, "%s: %s", fname, msg);
    else
      lua_pushstring(L, msg);
    lua_pushinteger(L, en);
    return 3;
  }
}